

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O0

bool __thiscall ProStringList::contains(ProStringList *this,char *str,CaseSensitivity cs)

{
  int iVar1;
  QList<ProString> *this_00;
  qsizetype qVar2;
  undefined4 in_EDX;
  QList<ProString> *in_RDI;
  int i;
  qsizetype in_stack_ffffffffffffffc8;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    this_00 = (QList<ProString> *)(long)iVar3;
    qVar2 = QList<ProString>::size(in_RDI);
    if (qVar2 <= (long)this_00) {
      return false;
    }
    QList<ProString>::at(this_00,in_stack_ffffffffffffffc8);
    iVar1 = ProString::compare((ProString *)CONCAT44(in_EDX,iVar3),(char *)in_RDI,
                               (CaseSensitivity)((ulong)this_00 >> 0x20));
    if (iVar1 == 0) break;
    iVar3 = iVar3 + 1;
  }
  return true;
}

Assistant:

bool ProStringList::contains(const char *str, Qt::CaseSensitivity cs) const
{
    for (int i = 0; i < size(); i++)
        if (!at(i).compare(str, cs))
            return true;
    return false;
}